

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

int32_t GetCheckRatio(NodeContext *node_ctx)

{
  int *piVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  ArgsManager *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int32_t iVar2;
  int *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  allocator<char> local_2d;
  undefined4 local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI,
             in_stack_ffffffffffffffb8);
  piVar1 = (int *)ArgsManager::GetIntArg
                            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_2c = SUB84(piVar1,0);
  piVar1 = std::clamp<int>(piVar1,in_stack_ffffffffffffff90,
                           (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar2 = *piVar1;
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  std::allocator<char>::~allocator(&local_2d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int32_t GetCheckRatio(const NodeContext& node_ctx)
{
    return std::clamp<int32_t>(node_ctx.args->GetIntArg("-checkaddrman", 100), 0, 1000000);
}